

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.c
# Opt level: O3

void * priority_queue_poll(priority_queue_t *queue)

{
  void *pvVar1;
  size_t sVar2;
  int iVar3;
  size_t sVar4;
  char *fmt;
  long ln;
  size_t sVar5;
  err_lvl_t lvl;
  void *pvVar6;
  ulong uVar7;
  
  sVar4 = queue->size;
  if (sVar4 == 0) {
    fmt = "Trying to poll from empty queue\n";
    ln = 0x4c;
    lvl = ERR_WARN;
  }
  else {
    pvVar1 = queue->max_element;
    if (pvVar1 != (void *)0x0) {
      sVar2 = queue->alloc_size;
      if (sVar2 == 0) {
        queue->max_element = (void *)0x0;
      }
      else {
        sVar5 = 0;
        do {
          if (queue->pointers[sVar5] == pvVar1) {
            queue->pointers[sVar5] = (void *)0x0;
            queue->max_element = (void *)0x0;
            if (sVar2 == 0) goto LAB_00114609;
            goto LAB_001145d1;
          }
          sVar5 = sVar5 + 1;
        } while (sVar2 != sVar5);
        queue->max_element = (void *)0x0;
LAB_001145d1:
        uVar7 = 0;
        do {
          pvVar6 = queue->pointers[uVar7];
          if (pvVar6 != (void *)0x0) {
            if (queue->max_element != (void *)0x0) {
              iVar3 = (*queue->compare)(pvVar6,queue->max_element);
              if (-1 < iVar3) goto LAB_001145fc;
              pvVar6 = queue->pointers[uVar7];
            }
            queue->max_element = pvVar6;
          }
LAB_001145fc:
          uVar7 = uVar7 + 1;
        } while (uVar7 < queue->alloc_size);
        sVar4 = queue->size;
      }
LAB_00114609:
      queue->size = sVar4 - 1;
      return pvVar1;
    }
    fmt = "Trying to poll from queue and max element is undefined\n";
    ln = 0x50;
    lvl = ERR_ERROR;
  }
  err_msg(lvl,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/priority_queue.c"
          ,ln,fmt);
  return (void *)0x0;
}

Assistant:

void* priority_queue_poll(priority_queue_t *queue)
{
    
    size_t i;
    void *res;

    if (queue->size == 0) {
        E_WARN("Trying to poll from empty queue\n");
        return NULL;
    }
    if (queue->max_element == NULL) {
        E_ERROR("Trying to poll from queue and max element is undefined\n");
        return NULL;
    }
    res = queue->max_element;
    for (i = 0; i < queue->alloc_size; i++) {
        if (queue->pointers[i] == queue->max_element) {
            queue->pointers[i] = NULL;
            break;
        }
    }
    queue->max_element = NULL;
    for (i = 0; i < queue->alloc_size; i++) {
        if (queue->pointers[i] == 0)
            continue;
        if (queue->max_element == NULL) {
            queue->max_element = queue->pointers[i];
        } else {
            if (queue->compare(queue->pointers[i], queue->max_element) < 0)
                queue->max_element = queue->pointers[i];
        }
    }
    queue->size--;
    return res;
}